

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

double * __thiscall
google::protobuf::RepeatedField<double>::unsafe_data(RepeatedField<double> *this)

{
  LogMessage *other;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  RepeatedField<double> *local_10;
  RepeatedField<double> *this_local;
  
  local_49 = 0;
  local_10 = this;
  if (this->rep_ == (Rep *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4e2);
    local_49 = 1;
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: rep_: ");
    internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  return this->rep_->elements;
}

Assistant:

inline const Element* RepeatedField<Element>::unsafe_data() const {
  GOOGLE_DCHECK(rep_);
  return rep_->elements;
}